

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

void __thiscall
Fixpp::impl::
MessageVisitor<should_visit_custom_message::Visitor,should_visit_custom_message::MyVisitRules>::
handleUnknownTag<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)48>,Fixpp::TagT<112u,Fixpp::Type::String>>,Fixpp::TypedParsingContext<void>>
          (MessageVisitor<should_visit_custom_message::Visitor,should_visit_custom_message::MyVisitRules>
           *this,Token *valueToken,TypedParsingContext<void> *message,undefined8 param_3,int tag)

{
  pair<const_char_*,_unsigned_long> local_48;
  int local_34;
  undefined8 uStack_30;
  int tag_local;
  TypedParsingContext<void> *param_3_local;
  VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_0_>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>
  *message_local;
  Token *valueToken_local;
  MessageVisitor<should_visit_custom_message::Visitor,_should_visit_custom_message::MyVisitRules>
  *this_local;
  
  local_34 = tag;
  uStack_30 = param_3;
  param_3_local = message;
  message_local =
       (VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_0_>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>
        *)valueToken;
  valueToken_local = (Token *)this;
  local_48 = StreamCursor::Token::view(valueToken);
  llvm::
  SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::TagT<112u,Fixpp::Type::String>>::Unparsed>
  ::emplace_back<int&,std::pair<char_const*,unsigned_long>>
            ((SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::TagT<112u,Fixpp::Type::String>>::Unparsed>
              *)((message->super_ParsingContext).error.storage_.__data + 0x18),&local_34,&local_48);
  return;
}

Assistant:

void handleUnknownTag(const StreamCursor::Token& valueToken, Message& message, Context& /*context*/, int tag,
                                  BoolPack<false, false>)
            {
                message.unparsed.emplace_back(tag, valueToken.view());
            }